

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::updateIcon
          (QFileSystemNode *this,QAbstractFileIconProvider *iconProvider,QString *path)

{
  bool bVar1;
  QString *path_00;
  QFileSystemNode **ppQVar2;
  ulong uVar3;
  QAbstractFileIconProvider *in_RDX;
  QFileSystemNode *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar4;
  QFileSystemNode *child;
  add_const_t<QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&> *in_stack_fffffffffffffed8;
  QFileSystemNode *in_stack_fffffffffffffee0;
  QFileSystemNode *a;
  QFileSystemNode *in_stack_fffffffffffffee8;
  QFileSystemNode *this_00;
  QFileSystemNode *in_stack_fffffffffffffef0;
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *in_stack_fffffffffffffef8;
  QAbstractFileIconProvider *iconProvider_00;
  QFileSystemNode *this_01;
  QChar local_62;
  piter local_60;
  piter local_50;
  QFileInfo local_40 [8];
  undefined1 local_38 [8];
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QFileSystemNode *)0x0) {
    this_00 = in_RSI;
    if (*(long *)(in_RDI + 0x38) != 0) {
      QFileInfo::QFileInfo(local_40,(QString *)in_RDX);
      (*(code *)(in_RSI->fileName).d.d[1].super_QArrayData.alloc)(local_38,in_RSI,local_40);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffef0,(QIcon *)in_stack_fffffffffffffee8);
      QIcon::~QIcon((QIcon *)in_stack_fffffffffffffee0);
      QFileInfo::~QFileInfo(local_40);
    }
    path_00 = (QString *)(in_RDI + 0x18);
    local_50.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d = (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_50 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::begin
                                (in_stack_fffffffffffffef8);
    local_60.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_60.d = (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_60 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::end
                                ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                                 in_stack_fffffffffffffee8);
    while (bVar1 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::
                   operator!=((const_iterator *)in_stack_fffffffffffffee8,
                              (const_iterator *)in_stack_fffffffffffffee0), bVar1) {
      ppQVar2 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::
                operator*((const_iterator *)0xaae7f1);
      a = *ppQVar2;
      bVar1 = QString::isEmpty((QString *)0xaae803);
      if (bVar1) {
        updateIcon(this_00,in_RDX,path_00);
        a = in_stack_fffffffffffffef0;
        iconProvider_00 = in_RDX;
      }
      else {
        iconProvider_00 = in_RDX;
        QChar::QChar<char16_t,_true>(&local_62,L'/');
        uVar3 = QString::endsWith((QChar)(char16_t)in_RDX,(uint)(ushort)local_62.ucs);
        if ((uVar3 & 1) == 0) {
          this_01 = this_00;
          QVar4 = ::operator+(&this_00->fileName,(char16_t *)a);
          local_30 = QVar4.a;
          local_28 = QVar4.b;
          ::operator+((QStringBuilder<const_QString_&,_char16_t> *)a,
                      (QString *)in_stack_fffffffffffffed8);
          ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffed8);
          updateIcon(this_01,iconProvider_00,path_00);
          QString::~QString((QString *)0xaae956);
          in_stack_fffffffffffffee0 = a;
          in_stack_fffffffffffffee8 = this_00;
          a = in_stack_fffffffffffffef0;
          this_00 = this_01;
        }
        else {
          ::operator+(&in_stack_fffffffffffffee0->fileName,(QString *)in_stack_fffffffffffffed8);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffffed8);
          updateIcon(this_00,iconProvider_00,path_00);
          QString::~QString((QString *)0xaae8b0);
        }
      }
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator++
                ((const_iterator *)a);
      in_stack_fffffffffffffef0 = a;
      in_RDX = iconProvider_00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void updateIcon(QAbstractFileIconProvider *iconProvider, const QString &path) {
            if (!iconProvider)
                return;

            if (info)
                info->icon = iconProvider->icon(QFileInfo(path));

            for (QFileSystemNode *child : std::as_const(children)) {
                //On windows the root (My computer) has no path so we don't want to add a / for nothing (e.g. /C:/)
                if (!path.isEmpty()) {
                    if (path.endsWith(u'/'))
                        child->updateIcon(iconProvider, path + child->fileName);
                    else
                        child->updateIcon(iconProvider, path + u'/' + child->fileName);
                } else
                    child->updateIcon(iconProvider, child->fileName);
            }
        }